

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::BeginFunctionBody
          (BinaryReaderIR *this,Index index,Offset size)

{
  Func *pFVar1;
  Result RVar2;
  reference ppFVar3;
  Location local_48;
  Offset local_28;
  Offset size_local;
  BinaryReaderIR *pBStack_18;
  Index index_local;
  BinaryReaderIR *this_local;
  
  local_28 = size;
  size_local._4_4_ = index;
  pBStack_18 = this;
  ppFVar3 = std::vector<wabt::Func_*,_std::allocator<wabt::Func_*>_>::operator[]
                      (&this->module_->funcs,(ulong)index);
  this->current_func_ = *ppFVar3;
  GetLocation(&local_48,this);
  pFVar1 = this->current_func_;
  (pFVar1->loc).filename._M_len = local_48.filename._M_len;
  (pFVar1->loc).filename._M_str = local_48.filename._M_str;
  (pFVar1->loc).field_1.field_1.offset = (size_t)local_48.field_1.field_1.offset;
  *(undefined8 *)((long)&(pFVar1->loc).field_1 + 8) = local_48.field_1._8_8_;
  RVar2 = PushLabel(this,First,&this->current_func_->exprs,(Expr *)0x0);
  return (Result)RVar2.enum_;
}

Assistant:

Result BinaryReaderIR::BeginFunctionBody(Index index, Offset size) {
  current_func_ = module_->funcs[index];
  current_func_->loc = GetLocation();
  return PushLabel(LabelType::Func, &current_func_->exprs);
}